

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallCMakeProject
          (cmCPackGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  undefined4 extraout_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  iterator iVar9;
  iterator iVar10;
  size_type __n;
  iterator __first2;
  iterator __last2;
  iterator __result;
  reference remote;
  mapped_type *pmVar11;
  bool local_2c5a;
  allocator<char> local_2a39;
  string local_2a38;
  allocator<char> local_2a11;
  string local_2a10;
  allocator<char> local_29e9;
  string local_29e8 [8];
  string absoluteDestFilesListComponent;
  allocator<char> local_29a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2980;
  undefined1 local_2960 [8];
  string absoluteDestFileComponent;
  undefined1 local_2920 [8];
  ostringstream cmCPackLog_msg_9;
  allocator<char> local_27a1;
  string local_27a0;
  allocator<char> local_2779;
  string local_2778;
  string local_2758 [32];
  undefined1 local_2738 [8];
  ostringstream cmCPackLog_msg_8;
  string local_25c0 [32];
  string local_25a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2580;
  undefined1 local_2578 [8];
  string localFileName;
  iterator fit;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2519;
  undefined1 local_2518 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  iterator diff;
  undefined1 local_24e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesAfter;
  Glob glA;
  string local_2470;
  allocator<char> local_2449;
  string local_2448;
  allocator<char> local_2421;
  string local_2420;
  byte local_23fa;
  allocator<char> local_23f9;
  undefined1 local_23f8 [6];
  bool res;
  byte local_23d3;
  byte local_23d2;
  allocator<char> local_23d1;
  string local_23d0;
  allocator<char> local_23a9;
  string local_23a8;
  allocator<char> local_2381;
  string local_2380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2360;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2358;
  undefined1 local_2350 [8];
  Glob glB;
  string findExpr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesBefore;
  string *InstallPrefix;
  string local_22b0;
  allocator<char> local_2289;
  string local_2288;
  allocator<char> local_2261;
  string local_2260;
  undefined1 local_2240 [8];
  string installComponentLowerCase;
  string local_2218;
  string local_21f8 [32];
  undefined1 local_21d8 [8];
  ostringstream cmCPackLog_msg_7;
  string local_2060 [32];
  undefined1 local_2040 [8];
  ostringstream cmCPackLog_msg_6;
  string local_1ec8 [32];
  undefined1 local_1ea8 [8];
  ostringstream cmCPackLog_msg_5;
  allocator<char> local_1d29;
  string local_1d28;
  uint local_1d04;
  string local_1d00 [32];
  undefined1 local_1ce0 [8];
  ostringstream cmCPackLog_msg_4;
  string local_1b68 [32];
  undefined1 local_1b48 [8];
  ostringstream cmCPackLog_msg_3;
  allocator<char> local_19c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1948;
  string local_1928 [32];
  undefined1 local_1908 [8];
  ostringstream cmCPackLog_msg_2;
  string local_1790 [32];
  undefined1 local_1770 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_15f1;
  string local_15f0;
  allocator<char> local_15c9;
  string local_15c8;
  allocator<char> local_15a1;
  string local_15a0;
  undefined1 local_1580 [8];
  string dir;
  string local_1558;
  allocator<char> local_1531;
  string local_1530;
  allocator<char> local_1509;
  string local_1508;
  allocator<char> local_14e1;
  string local_14e0;
  allocator<char> local_14b9;
  string local_14b8;
  char *local_1498;
  char *default_dir_inst_permissions;
  string local_1488;
  allocator<char> local_1461;
  string local_1460;
  string local_1440 [32];
  cmStateSnapshot local_1420;
  undefined1 local_1408 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  ProgressCallbackType local_610;
  cmStateSnapshot local_5f0;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  undefined1 local_588 [8];
  cmake cm;
  undefined1 local_210 [8];
  ostringstream cmCPackLog_msg;
  undefined1 local_88 [8];
  string installFile;
  string tempInstallDirectory;
  bool componentInstall_local;
  string *component_local;
  mode_t *default_dir_mode_local;
  string *baseTempInstallDirectory_local;
  string *installDirectory_local;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)(installFile.field_2._M_local_buf + 8),(string *)baseTempInstallDirectory);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 installDirectory,"/cmake_install.cmake");
  if (componentInstall) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    poVar5 = std::operator<<((ostream *)local_210,"-   Install component: ");
    poVar5 = std::operator<<(poVar5,(string *)component);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2ac,pcVar6);
    std::__cxx11::string::~string
              ((string *)
               &cm.TraceOnlyThisSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  }
  cmake::cmake((cmake *)local_588,RoleScript,CPack);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
  cmake::SetHomeDirectory((cmake *)local_588,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"",&local_5d1);
  cmake::SetHomeOutputDirectory((cmake *)local_588,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  cmake::GetCurrentSnapshot(&local_5f0,(cmake *)local_588);
  cmStateSnapshot::SetDefaultDefinitions(&local_5f0);
  cmake::AddCMakePaths((cmake *)local_588);
  gg._1536_8_ = this;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCPackGenerator::InstallCMakeProject(bool,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int_const*,std::__cxx11::string_const&,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::__0,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_610,
             (anon_class_8_1_8991fb9c *)&gg.InstallTargetEnabled);
  cmake::SetProgressCallback((cmake *)local_588,&local_610);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_610);
  cmake::SetTrace((cmake *)local_588,(bool)(this->Trace & 1));
  cmake::SetTraceExpand((cmake *)local_588,(bool)(this->TraceExpand & 1));
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_588);
  cmake::GetCurrentSnapshot(&local_1420,(cmake *)local_588);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1408,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,&local_1420);
  uVar7 = std::__cxx11::string::empty();
  if ((((uVar7 & 1) == 0) && (bVar2 = std::operator!=(installSubDirectory,"/"), bVar2)) &&
     (bVar2 = std::operator!=(installSubDirectory,"."), bVar2)) {
    std::__cxx11::string::operator+=
              ((string *)(installFile.field_2._M_local_buf + 8),(string *)installSubDirectory);
  }
  if (componentInstall) {
    std::__cxx11::string::operator+=((string *)(installFile.field_2._M_local_buf + 8),"/");
    (*this->_vptr_cmCPackGenerator[7])(local_1440,this,component);
    std::__cxx11::string::operator+=((string *)(installFile.field_2._M_local_buf + 8),local_1440);
    std::__cxx11::string::~string(local_1440);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1460,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",&local_1461);
    bVar2 = IsOn(this,&local_1460);
    std::__cxx11::string::~string((string *)&local_1460);
    std::allocator<char>::~allocator(&local_1461);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)(installFile.field_2._M_local_buf + 8),"/");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1488,"CPACK_PACKAGE_FILE_NAME",
                 (allocator<char> *)((long)&default_dir_inst_permissions + 7));
      pcVar6 = GetOption(this,&local_1488);
      std::__cxx11::string::operator+=((string *)(installFile.field_2._M_local_buf + 8),pcVar6);
      std::__cxx11::string::~string((string *)&local_1488);
      std::allocator<char>::~allocator((allocator<char> *)((long)&default_dir_inst_permissions + 7))
      ;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14b8,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",&local_14b9);
  pcVar6 = GetOption(this,&local_14b8);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator(&local_14b9);
  local_1498 = pcVar6;
  if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14e0,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",&local_14e1);
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_14e0,local_1498);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::allocator<char>::~allocator(&local_14e1);
  }
  if (setDestDir) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1508,"CPACK_SET_DESTDIR",&local_1509);
    pcVar6 = GetOption(this,&local_1508);
    bVar2 = cmSystemTools::IsInternallyOn(pcVar6);
    std::__cxx11::string::~string((string *)&local_1508);
    std::allocator<char>::~allocator(&local_1509);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1530,"CPACK_INSTALL_PREFIX",&local_1531);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1558,"CPACK_PACKAGING_INSTALL_PREFIX",
                 (allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      pcVar6 = GetOption(this,&local_1558);
      SetOption(this,&local_1530,pcVar6);
      std::__cxx11::string::~string((string *)&local_1558);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_1530);
      std::allocator<char>::~allocator(&local_1531);
    }
    std::__cxx11::string::string((string *)local_1580);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15a0,"CPACK_INSTALL_PREFIX",&local_15a1);
    pcVar6 = GetOption(this,&local_15a0);
    std::__cxx11::string::~string((string *)&local_15a0);
    std::allocator<char>::~allocator(&local_15a1);
    if (pcVar6 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15c8,"CPACK_INSTALL_PREFIX",&local_15c9);
      pcVar6 = GetOption(this,&local_15c8);
      std::__cxx11::string::operator+=((string *)local_1580,pcVar6);
      std::__cxx11::string::~string((string *)&local_15c8);
      std::allocator<char>::~allocator(&local_15c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15f0,"CMAKE_INSTALL_PREFIX",&local_15f1);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_15f0,pcVar6);
    std::__cxx11::string::~string((string *)&local_15f0);
    std::allocator<char>::~allocator(&local_15f1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1770);
    poVar5 = std::operator<<((ostream *)local_1770,
                             "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f2,pcVar6);
    std::__cxx11::string::~string(local_1790);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1770);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1908);
    poVar5 = std::operator<<((ostream *)local_1908,"- Setting CMAKE_INSTALL_PREFIX to \'");
    poVar5 = std::operator<<(poVar5,(string *)local_1580);
    poVar5 = std::operator<<(poVar5,"\'");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f5,pcVar6);
    std::__cxx11::string::~string(local_1928);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1908);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::StringStartsWith(pcVar6,"/");
    if (bVar2) {
      std::operator+(&local_1948,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&installFile.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1580
                    );
      std::__cxx11::string::operator=((string *)local_1580,(string *)&local_1948);
      std::__cxx11::string::~string((string *)&local_1948);
    }
    else {
      std::operator+(&local_1988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&installFile.field_2 + 8),"/");
      std::operator+(&local_1968,&local_1988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1580
                    );
      std::__cxx11::string::operator=((string *)local_1580,(string *)&local_1968);
      std::__cxx11::string::~string((string *)&local_1968);
      std::__cxx11::string::~string((string *)&local_1988);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_19c8,"DESTDIR=",&local_19c9)
    ;
    std::operator+(&local_19a8,&local_19c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&installFile.field_2 + 8));
    cmsys::SystemTools::PutEnv(&local_19a8);
    std::__cxx11::string::~string((string *)&local_19a8);
    std::__cxx11::string::~string((string *)&local_19c8);
    std::allocator<char>::~allocator(&local_19c9);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b48);
    poVar5 = std::operator<<((ostream *)local_1b48,"- Creating directory: \'");
    poVar5 = std::operator<<(poVar5,(string *)local_1580);
    poVar5 = std::operator<<(poVar5,"\'");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x30c,pcVar6);
    std::__cxx11::string::~string(local_1b68);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b48);
    bVar2 = cmsys::SystemTools::MakeDirectory((string *)local_1580,default_dir_mode);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ce0);
      poVar5 = std::operator<<((ostream *)local_1ce0,"Problem creating temporary directory: ");
      poVar5 = std::operator<<(poVar5,(string *)local_1580);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x311,pcVar6);
      std::__cxx11::string::~string(local_1d00);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ce0);
      this_local._4_4_ = 0;
    }
    local_1d04 = (uint)!bVar2;
    std::__cxx11::string::~string((string *)local_1580);
    if (local_1d04 != 0) goto LAB_00156709;
  }
  else {
    iVar3 = (*this->_vptr_cmCPackGenerator[0xb])();
    std::__cxx11::string::operator+=
              ((string *)(installFile.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var,iVar3)
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d28,"CMAKE_INSTALL_PREFIX",&local_1d29);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_1d28,pcVar6);
    std::__cxx11::string::~string((string *)&local_1d28);
    std::allocator<char>::~allocator(&local_1d29);
    bVar2 = cmsys::SystemTools::MakeDirectory
                      ((string *)((long)&installFile.field_2 + 8),default_dir_mode);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ea8);
      poVar5 = std::operator<<((ostream *)local_1ea8,"Problem creating temporary directory: ");
      poVar5 = std::operator<<(poVar5,(string *)(installFile.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x31b,pcVar6);
      std::__cxx11::string::~string(local_1ec8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ea8);
      this_local._4_4_ = 0;
      local_1d04 = 1;
      goto LAB_00156709;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2040);
    poVar5 = std::operator<<((ostream *)local_2040,
                             "- Using non-DESTDIR install... (mf.AddDefinition)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x321,pcVar6);
    std::__cxx11::string::~string(local_2060);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2040);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_21d8);
    poVar5 = std::operator<<((ostream *)local_21d8,"- Setting CMAKE_INSTALL_PREFIX to \'");
    poVar5 = std::operator<<(poVar5,(string *)(installFile.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"\'");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x324,pcVar6);
    std::__cxx11::string::~string(local_21f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_21d8);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2218,"BUILD_TYPE",
               (allocator<char> *)(installComponentLowerCase.field_2._M_local_buf + 0xf));
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_2218,pcVar6);
    std::__cxx11::string::~string((string *)&local_2218);
    std::allocator<char>::~allocator
              ((allocator<char> *)(installComponentLowerCase.field_2._M_local_buf + 0xf));
  }
  cmsys::SystemTools::LowerCase((string *)local_2240,component);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2240,"all");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2260,"CMAKE_INSTALL_COMPONENT",&local_2261);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_2260,pcVar6);
    std::__cxx11::string::~string((string *)&local_2260);
    std::allocator<char>::~allocator(&local_2261);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2288,"CPACK_STRIP_FILES",&local_2289);
  pcVar6 = GetOption(this,&local_2288);
  bVar2 = cmSystemTools::IsOff(pcVar6);
  std::__cxx11::string::~string((string *)&local_2288);
  std::allocator<char>::~allocator(&local_2289);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22b0,"CMAKE_INSTALL_DO_STRIP",
               (allocator<char> *)((long)&InstallPrefix + 7));
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_22b0,"1");
    std::__cxx11::string::~string((string *)&local_22b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&InstallPrefix + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&findExpr.field_2 + 8));
  std::__cxx11::string::string
            ((string *)&glB.ListDirs,(string *)(installFile.field_2._M_local_buf + 8));
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)local_2350);
    std::__cxx11::string::operator+=((string *)&glB.ListDirs,"/*");
    cmsys::Glob::RecurseOn((Glob *)local_2350);
    cmsys::Glob::SetRecurseListDirs((Glob *)local_2350,true);
    cmsys::Glob::FindFiles((Glob *)local_2350,(string *)&glB.ListDirs,(GlobMessages *)0x0);
    pvVar8 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_2350);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&findExpr.field_2 + 8),pvVar8);
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    local_2358._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(pvVar8);
    local_2360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_2358,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_2360);
    cmsys::Glob::~Glob((Glob *)local_2350);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2380,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",&local_2381);
  bVar2 = IsOn(this,&local_2380);
  std::__cxx11::string::~string((string *)&local_2380);
  std::allocator<char>::~allocator(&local_2381);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23a8,"CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",&local_23a9);
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_23a8,"1");
    std::__cxx11::string::~string((string *)&local_23a8);
    std::allocator<char>::~allocator(&local_23a9);
  }
  local_23d2 = 0;
  local_23d3 = 0;
  uVar4 = (*this->_vptr_cmCPackGenerator[0x17])();
  local_2c5a = true;
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    local_23d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23d0,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",&local_23d1);
    local_23d3 = 1;
    local_2c5a = IsOn(this,&local_23d0);
  }
  if ((local_23d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_23d0);
  }
  if ((local_23d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_23d1);
  }
  if (local_2c5a != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_23f8,"CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",&local_23f9);
    cmMakefile::AddDefinition((cmMakefile *)local_1408,(string *)local_23f8,"1");
    std::__cxx11::string::~string((string *)local_23f8);
    std::allocator<char>::~allocator(&local_23f9);
  }
  local_23fa = cmMakefile::ReadListFile((cmMakefile *)local_1408,(string *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2420,"CMAKE_ABSOLUTE_DESTINATION_FILES",&local_2421);
  pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_2420);
  std::__cxx11::string::~string((string *)&local_2420);
  std::allocator<char>::~allocator(&local_2421);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2448,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_2449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2470,"CMAKE_ABSOLUTE_DESTINATION_FILES",
               (allocator<char> *)&glA.field_0x57);
    pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_2470);
    cmMakefile::AddDefinition((cmMakefile *)local_1408,&local_2448,pcVar6);
    std::__cxx11::string::~string((string *)&local_2470);
    std::allocator<char>::~allocator((allocator<char> *)&glA.field_0x57);
    std::__cxx11::string::~string((string *)&local_2448);
    std::allocator<char>::~allocator(&local_2449);
  }
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)&filesAfter.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmsys::Glob::RecurseOn
              ((Glob *)&filesAfter.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmsys::Glob::SetRecurseListDirs
              ((Glob *)&filesAfter.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
    cmsys::Glob::SetRecurseThroughSymlinks
              ((Glob *)&filesAfter.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    cmsys::Glob::FindFiles
              ((Glob *)&filesAfter.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&glB.ListDirs,
               (GlobMessages *)0x0);
    pvVar8 = cmsys::Glob::GetFiles_abi_cxx11_
                       ((Glob *)&filesAfter.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_24e8,pvVar8);
    iVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_24e8);
    iVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_24e8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar9._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar10._M_current);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&result.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_24e8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_2519);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2518,__n,&local_2519);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_2519);
    iVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_24e8);
    iVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_24e8);
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    __first2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar8);
    __last2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(pvVar8);
    __result = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2518);
    result.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  set_difference<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )iVar9._M_current,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )iVar10._M_current,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )__first2._M_current,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )__last2._M_current,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )__result._M_current);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&localFileName.field_2 + 8));
    std::__cxx11::string::string((string *)local_2578);
    local_2580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2518);
    localFileName.field_2._8_8_ = local_2580;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)((long)&localFileName.field_2 + 8),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&result.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2) {
      remote = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&localFileName.field_2 + 8));
      cmSystemTools::RelativePath
                (&local_25a0,(string *)(installFile.field_2._M_local_buf + 8),remote);
      std::__cxx11::string::operator=((string *)local_2578,(string *)&local_25a0);
      std::__cxx11::string::~string((string *)&local_25a0);
      std::__cxx11::string::find_first_not_of((char)(string *)local_2578,0x2f);
      std::__cxx11::string::substr((ulong)local_25c0,(ulong)local_2578);
      std::__cxx11::string::operator=((string *)local_2578,local_25c0);
      std::__cxx11::string::~string(local_25c0);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&this->Components,component);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar11->Files,(value_type *)local_2578);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2738);
      poVar5 = std::operator<<((ostream *)local_2738,"Adding file <");
      poVar5 = std::operator<<(poVar5,(string *)local_2578);
      poVar5 = std::operator<<(poVar5,"> to component <");
      poVar5 = std::operator<<(poVar5,(string *)component);
      poVar5 = std::operator<<(poVar5,">");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x374,pcVar6);
      std::__cxx11::string::~string(local_2758);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2738);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&localFileName.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)local_2578);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2518);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_24e8);
    cmsys::Glob::~Glob((Glob *)&filesAfter.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2778,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_2779);
  pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_2778);
  std::__cxx11::string::~string((string *)&local_2778);
  std::allocator<char>::~allocator(&local_2779);
  if (pcVar6 != (char *)0x0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)absoluteDestFiles,";");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27a0,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_27a1);
    pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_27a0);
    std::__cxx11::string::operator+=((string *)absoluteDestFiles,pcVar6);
    std::__cxx11::string::~string((string *)&local_27a0);
    std::allocator<char>::~allocator(&local_27a1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2920);
    poVar5 = std::operator<<((ostream *)local_2920,"Got some ABSOLUTE DESTINATION FILES: ");
    poVar5 = std::operator<<(poVar5,(string *)absoluteDestFiles);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x37f,pcVar6);
    std::__cxx11::string::~string((string *)(absoluteDestFileComponent.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2920);
    if (componentInstall) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_29a0,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_29a1);
      std::operator+(&local_2980,&local_29a0,"_");
      (*this->_vptr_cmCPackGenerator[7])
                ((undefined1 *)((long)&absoluteDestFilesListComponent.field_2 + 8),this,component);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2960
                     ,&local_2980,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&absoluteDestFilesListComponent.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)(absoluteDestFilesListComponent.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_2980);
      std::__cxx11::string::~string((string *)&local_29a0);
      std::allocator<char>::~allocator(&local_29a1);
      pcVar6 = GetOption(this,(string *)local_2960);
      if (pcVar6 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a38,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_2a39);
        pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_2a38);
        SetOption(this,(string *)local_2960,pcVar6);
        std::__cxx11::string::~string((string *)&local_2a38);
        std::allocator<char>::~allocator(&local_2a39);
      }
      else {
        pcVar6 = GetOption(this,(string *)local_2960);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_29e8,pcVar6,&local_29e9);
        std::allocator<char>::~allocator(&local_29e9);
        std::__cxx11::string::operator+=(local_29e8,";");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a10,"CPACK_ABSOLUTE_DESTINATION_FILES",&local_2a11);
        pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1408,&local_2a10);
        std::__cxx11::string::operator+=(local_29e8,pcVar6);
        std::__cxx11::string::~string((string *)&local_2a10);
        std::allocator<char>::~allocator(&local_2a11);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        SetOption(this,(string *)local_2960,pcVar6);
        std::__cxx11::string::~string(local_29e8);
      }
      std::__cxx11::string::~string((string *)local_2960);
    }
  }
  bVar2 = cmSystemTools::GetErrorOccuredFlag();
  if ((bVar2) || ((local_23fa & 1) == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  local_1d04 = 1;
  std::__cxx11::string::~string((string *)&glB.ListDirs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&findExpr.field_2 + 8));
  std::__cxx11::string::~string((string *)local_2240);
LAB_00156709:
  cmMakefile::~cmMakefile((cmMakefile *)local_1408);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_588);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(installFile.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  std::string tempInstallDirectory = baseTempInstallDirectory;
  std::string installFile = installDirectory + "/cmake_install.cmake";

  if (componentInstall) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "-   Install component: " << component << std::endl);
  }

  cmake cm(cmake::RoleScript, cmState::CPack);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cm.AddCMakePaths();
  cm.SetProgressCallback([this](const std::string& msg, float prog) {
    this->DisplayVerboseOutput(msg, prog);
  });
  cm.SetTrace(this->Trace);
  cm.SetTraceExpand(this->TraceExpand);
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!installSubDirectory.empty() && installSubDirectory != "/" &&
      installSubDirectory != ".") {
    tempInstallDirectory += installSubDirectory;
  }
  if (componentInstall) {
    tempInstallDirectory += "/";
    // Some CPack generators would rather chose
    // the local installation directory suffix.
    // Some (e.g. RPM) use
    //  one install directory for each component **GROUP**
    // instead of the default
    //  one install directory for each component.
    tempInstallDirectory += GetComponentInstallDirNameSuffix(component);
    if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
      tempInstallDirectory += "/";
      tempInstallDirectory += this->GetOption("CPACK_PACKAGE_FILE_NAME");
    }
  }

  const char* default_dir_inst_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_inst_permissions && *default_dir_inst_permissions) {
    mf.AddDefinition("CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
                     default_dir_inst_permissions);
  }

  if (!setDestDir) {
    tempInstallDirectory += this->GetPackagingInstallPrefix();
  }

  if (setDestDir) {
    // For DESTDIR based packaging, use the *project*
    // CMAKE_INSTALL_PREFIX underneath the tempInstallDirectory. The
    // value of the project's CMAKE_INSTALL_PREFIX is sent in here as
    // the value of the CPACK_INSTALL_PREFIX variable.
    //
    // If DESTDIR has been 'internally set ON' this means that
    // the underlying CPack specific generator did ask for that
    // In this case we may override CPACK_INSTALL_PREFIX with
    // CPACK_PACKAGING_INSTALL_PREFIX
    // I know this is tricky and awkward but it's the price for
    // CPACK_SET_DESTDIR backward compatibility.
    if (cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"))) {
      this->SetOption("CPACK_INSTALL_PREFIX",
                      this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX"));
    }
    std::string dir;
    if (this->GetOption("CPACK_INSTALL_PREFIX")) {
      dir += this->GetOption("CPACK_INSTALL_PREFIX");
    }
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", dir.c_str());

    cmCPackLogger(
      cmCPackLog::LOG_DEBUG,
      "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)"
        << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                        << std::endl);

    // Make sure that DESTDIR + CPACK_INSTALL_PREFIX directory
    // exists:
    //
    if (cmSystemTools::StringStartsWith(dir.c_str(), "/")) {
      dir = tempInstallDirectory + dir;
    } else {
      dir = tempInstallDirectory + "/" + dir;
    }
    /*
     *  We must re-set DESTDIR for each component
     *  We must not add the CPACK_INSTALL_PREFIX part because
     *  it will be added using the override of CMAKE_INSTALL_PREFIX
     *  The main reason for this awkward trick is that
     *  are using DESTDIR for 2 different reasons:
     *     - Because it was asked by the CPack Generator or the user
     *       using CPACK_SET_DESTDIR
     *     - Because it was already used for component install
     *       in order to put things in subdirs...
     */
    cmSystemTools::PutEnv(std::string("DESTDIR=") + tempInstallDirectory);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Creating directory: '" << dir << "'" << std::endl);

    if (!cmsys::SystemTools::MakeDirectory(dir, default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: " << dir
                                                             << std::endl);
      return 0;
    }
  } else {
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

    if (!cmsys::SystemTools::MakeDirectory(tempInstallDirectory,
                                           default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }

    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Using non-DESTDIR install... (mf.AddDefinition)"
                    << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
                                                        << "'" << std::endl);
  }

  if (!buildConfig.empty()) {
    mf.AddDefinition("BUILD_TYPE", buildConfig.c_str());
  }
  std::string installComponentLowerCase = cmSystemTools::LowerCase(component);
  if (installComponentLowerCase != "all") {
    mf.AddDefinition("CMAKE_INSTALL_COMPONENT", component.c_str());
  }

  // strip on TRUE, ON, 1, one or several file names, but not on
  // FALSE, OFF, 0 and an empty string
  if (!cmSystemTools::IsOff(this->GetOption("CPACK_STRIP_FILES"))) {
    mf.AddDefinition("CMAKE_INSTALL_DO_STRIP", "1");
  }
  // Remember the list of files before installation
  // of the current component (if we are in component install)
  std::string const& InstallPrefix = tempInstallDirectory;
  std::vector<std::string> filesBefore;
  std::string findExpr = tempInstallDirectory;
  if (componentInstall) {
    cmsys::Glob glB;
    findExpr += "/*";
    glB.RecurseOn();
    glB.SetRecurseListDirs(true);
    glB.FindFiles(findExpr);
    filesBefore = glB.GetFiles();
    std::sort(filesBefore.begin(), filesBefore.end());
  }

  // If CPack was asked to warn on ABSOLUTE INSTALL DESTINATION
  // then forward request to cmake_install.cmake script
  if (this->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // If current CPack generator does support
  // ABSOLUTE INSTALL DESTINATION or CPack has been asked for
  // then ask cmake_install.cmake script to error out
  // as soon as it occurs (before installing file)
  if (!SupportsAbsoluteDestination() ||
      this->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // do installation
  bool res = mf.ReadListFile(installFile);
  // forward definition of CMAKE_ABSOLUTE_DESTINATION_FILES
  // to CPack (may be used by generators like CPack RPM or DEB)
  // in order to transparently handle ABSOLUTE PATH
  if (mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES")) {
    mf.AddDefinition("CPACK_ABSOLUTE_DESTINATION_FILES",
                     mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES"));
  }

  // Now rebuild the list of files after installation
  // of the current component (if we are in component install)
  if (componentInstall) {
    cmsys::Glob glA;
    glA.RecurseOn();
    glA.SetRecurseListDirs(true);
    glA.SetRecurseThroughSymlinks(false);
    glA.FindFiles(findExpr);
    std::vector<std::string> filesAfter = glA.GetFiles();
    std::sort(filesAfter.begin(), filesAfter.end());
    std::vector<std::string>::iterator diff;
    std::vector<std::string> result(filesAfter.size());
    diff = std::set_difference(filesAfter.begin(), filesAfter.end(),
                               filesBefore.begin(), filesBefore.end(),
                               result.begin());

    std::vector<std::string>::iterator fit;
    std::string localFileName;
    // Populate the File field of each component
    for (fit = result.begin(); fit != diff; ++fit) {
      localFileName = cmSystemTools::RelativePath(InstallPrefix, *fit);
      localFileName =
        localFileName.substr(localFileName.find_first_not_of('/'));
      Components[component].Files.push_back(localFileName);
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Adding file <" << localFileName << "> to component <"
                                    << component << ">" << std::endl);
    }
  }

  if (nullptr != mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES")) {
    if (!absoluteDestFiles.empty()) {
      absoluteDestFiles += ";";
    }
    absoluteDestFiles += mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Got some ABSOLUTE DESTINATION FILES: " << absoluteDestFiles
                                                          << std::endl);
    // define component specific var
    if (componentInstall) {
      std::string absoluteDestFileComponent =
        std::string("CPACK_ABSOLUTE_DESTINATION_FILES") + "_" +
        GetComponentInstallDirNameSuffix(component);
      if (nullptr != this->GetOption(absoluteDestFileComponent)) {
        std::string absoluteDestFilesListComponent =
          this->GetOption(absoluteDestFileComponent);
        absoluteDestFilesListComponent += ";";
        absoluteDestFilesListComponent +=
          mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
        this->SetOption(absoluteDestFileComponent,
                        absoluteDestFilesListComponent.c_str());
      } else {
        this->SetOption(absoluteDestFileComponent,
                        mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES"));
      }
    }
  }
  if (cmSystemTools::GetErrorOccuredFlag() || !res) {
    return 0;
  }
  return 1;
}